

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseModuleStructs(Parser *this,ScannedTopLevelItem *item)

{
  char *pcVar1;
  Module *pMVar2;
  Structure *s;
  pointer pUVar3;
  ulong uVar4;
  
  (this->module).object = item->module;
  pcVar1 = (item->moduleStartPos).data;
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data != pcVar1) {
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    ).input.data = pcVar1;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
  }
  pMVar2 = (this->module).object;
  if (pMVar2 != (Module *)0x0) {
    if ((pMVar2->structs).structs.numActive !=
        (long)(item->structBodyCode).
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(item->structBodyCode).
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) {
      throwInternalCompilerError
                ("module->structs.size() == item.structBodyCode.size()","parseModuleStructs",0xd6);
    }
    pcVar1 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location.location.data;
    pUVar3 = (item->structBodyCode).
             super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((item->structBodyCode).
        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
        super__Vector_impl_data._M_finish != pUVar3) {
      uVar4 = 0;
      do {
        if ((this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).input.data != pUVar3[uVar4].data) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data = pUVar3[uVar4].data;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
        }
        pMVar2 = (this->module).object;
        if (pMVar2 == (Module *)0x0) goto LAB_0022e8a7;
        if ((pMVar2->structs).structs.numActive <= uVar4) {
          throwInternalCompilerError("i < size()","operator[]",0xc4);
        }
        s = (pMVar2->structs).structs.items[uVar4].object;
        if (s == (Structure *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x46);
        }
        parseStructBody(this,s);
        uVar4 = uVar4 + 1;
        pUVar3 = (item->structBodyCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(item->structBodyCode).
                                     super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 3)
              );
    }
    if ((this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ).input.data != pcVar1) {
      (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data = pcVar1;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
    }
    (this->module).object = (Module *)0x0;
    return;
  }
LAB_0022e8a7:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseModuleStructs (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->structs.size() == item.structBodyCode.size());

        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.structBodyCode.size(); ++i)
        {
            resetPosition (item.structBodyCode[i]);
            parseStructBody (*module->structs.get()[i]);
        }

        resetPosition (nextItemPos);
        module.reset();
    }